

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O3

void __thiscall Array::printArray(Array *this)

{
  long lVar1;
  long lVar2;
  
  if (0 < this->_height) {
    lVar2 = 0;
    do {
      if (0 < this->_width) {
        lVar1 = 0;
        do {
          printf("%4d",(ulong)(uint)this->_data[lVar2][lVar1]);
          lVar1 = lVar1 + 1;
        } while (lVar1 < this->_width);
      }
      putchar(10);
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->_height);
  }
  return;
}

Assistant:

void Array::printArray()
{
	for (int i = 0; i < getHeight(); ++i) {
		for (int j = 0; j < getWidth(); ++j) {
			printf("%4d", _data[i][j]);
		}
		printf("\n");
	}
}